

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O0

void __thiscall xmrig::ClientWriteBaton::~ClientWriteBaton(ClientWriteBaton *this)

{
  long in_RDI;
  
  std::__cxx11::string::~string((string *)(in_RDI + 0x100));
  std::__cxx11::string::~string((string *)(in_RDI + 0xe0));
  return;
}

Assistant:

inline ClientWriteBaton(const std::string &header, std::string &&body) :
        m_body(std::move(body)),
        m_header(header)
    {
        bufs[0].len  = m_header.size();
        bufs[0].base = const_cast<char *>(m_header.c_str());

        if (!m_body.empty()) {
            bufs[1].len  = m_body.size();
            bufs[1].base = const_cast<char *>(m_body.c_str());
        }
        else {
            bufs[1].base = nullptr;
            bufs[1].len  = 0;
        }
    }